

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

Table * sqlite3FindTable(sqlite3 *db,char *zName,char *zDatabase)

{
  char cVar1;
  byte bVar2;
  uint uVar3;
  byte *pbVar4;
  char *pcVar5;
  Table *pTVar6;
  uint uVar7;
  byte *pbVar8;
  uint uVar9;
  uint uVar10;
  bool bVar11;
  
  if (zName == (char *)0x0) {
    uVar9 = 0;
  }
  else {
    uVar9 = 0xffffffff;
    pcVar5 = zName;
    do {
      uVar9 = uVar9 + 1;
      cVar1 = *pcVar5;
      pcVar5 = pcVar5 + 1;
    } while (cVar1 != '\0');
    uVar9 = uVar9 & 0x3fffffff;
  }
  uVar3 = db->nDb;
  uVar10 = 0;
  if ((int)uVar3 < 1) {
    pTVar6 = (Table *)0x0;
  }
  else {
    pTVar6 = (Table *)0x0;
    do {
      uVar7 = uVar10 < 2 ^ uVar10;
      if (zDatabase == (char *)0x0) {
LAB_00172a30:
        pTVar6 = (Table *)sqlite3HashFind(&(db->aDb[uVar7].pSchema)->tblHash,zName,uVar9);
        bVar11 = pTVar6 != (Table *)0x0;
      }
      else {
        pbVar8 = (byte *)db->aDb[uVar7].zName;
        bVar2 = *zDatabase;
        pbVar4 = (byte *)(zDatabase + 1);
        while ((bVar2 != 0 && (""[bVar2] == ""[*pbVar8]))) {
          pbVar8 = pbVar8 + 1;
          bVar2 = *pbVar4;
          pbVar4 = pbVar4 + 1;
        }
        if (""[bVar2] == ""[*pbVar8]) goto LAB_00172a30;
        bVar11 = false;
      }
    } while ((!bVar11) && (uVar10 = uVar10 + 1, uVar10 != uVar3));
  }
  return pTVar6;
}

Assistant:

SQLITE_PRIVATE Table *sqlite3FindTable(sqlite3 *db, const char *zName, const char *zDatabase){
  Table *p = 0;
  int i;
  int nName;
  assert( zName!=0 );
  nName = sqlite3Strlen30(zName);
  /* All mutexes are required for schema access.  Make sure we hold them. */
  assert( zDatabase!=0 || sqlite3BtreeHoldsAllMutexes(db) );
  for(i=OMIT_TEMPDB; i<db->nDb; i++){
    int j = (i<2) ? i^1 : i;   /* Search TEMP before MAIN */
    if( zDatabase!=0 && sqlite3StrICmp(zDatabase, db->aDb[j].zName) ) continue;
    assert( sqlite3SchemaMutexHeld(db, j, 0) );
    p = sqlite3HashFind(&db->aDb[j].pSchema->tblHash, zName, nName);
    if( p ) break;
  }
  return p;
}